

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer-source.cc
# Opt level: O2

size_t __thiscall wabt::LexerSource::Fill(LexerSource *this,void *dest,Offset size)

{
  ulong __n;
  
  __n = this->size_ - this->read_offset_;
  if (size <= __n) {
    __n = size;
  }
  if (__n != 0) {
    memcpy(dest,(void *)(this->read_offset_ + (long)this->data_),__n);
    this->read_offset_ = this->read_offset_ + __n;
  }
  return __n;
}

Assistant:

size_t LexerSource::Fill(void* dest, Offset size) {
  Offset read_size = std::min(size, size_ - read_offset_);
  if (read_size > 0) {
    const void* src = static_cast<const char*>(data_) + read_offset_;
    memcpy(dest, src, read_size);
    read_offset_ += read_size;
  }
  return read_size;
}